

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

VarExtend * __thiscall kratos::Var::extend(Var *this,uint32_t width)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  mapped_type *pmVar3;
  ulong uVar4;
  element_type *peVar5;
  __node_base_ptr p_Var6;
  __node_base_ptr p_Var7;
  __shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  VarExtend *local_30;
  shared_ptr<kratos::VarExtend> p;
  uint32_t width_local;
  
  uVar1 = (this->extended_)._M_h._M_bucket_count;
  uVar4 = (ulong)width % uVar1;
  p_Var6 = (this->extended_)._M_h._M_buckets[uVar4];
  p_Var7 = (__node_base_ptr)0x0;
  if ((p_Var6 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var6->_M_nxt, p_Var7 = p_Var6, *(uint32_t *)&p_Var6->_M_nxt[1]._M_nxt != width)) {
    while (p_Var6 = p_Var2, p_Var2 = p_Var6->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var7 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var2[1]._M_nxt % uVar1 != uVar4) ||
         (p_Var7 = p_Var6, *(uint *)&p_Var2[1]._M_nxt == width)) goto LAB_0019f118;
    }
    p_Var7 = (__node_base_ptr)0x0;
  }
LAB_0019f118:
  p.super___shared_ptr<kratos::VarExtend,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       width;
  if ((p_Var7 == (__node_base_ptr)0x0) || (p_Var7->_M_nxt == (_Hash_node_base *)0x0)) {
    std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
              (local_40,(__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                        &this->super_enable_shared_from_this<kratos::Var>);
    local_30 = (VarExtend *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<kratos::VarExtend,std::allocator<kratos::VarExtend>,std::shared_ptr<kratos::Var>,unsigned_int&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p,&local_30,
               (allocator<kratos::VarExtend> *)
               ((long)&p.super___shared_ptr<kratos::VarExtend,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 3),(shared_ptr<kratos::Var> *)local_40,
               (uint *)((long)&p.super___shared_ptr<kratos::VarExtend,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi + 4));
    std::__shared_ptr<kratos::VarExtend,(__gnu_cxx::_Lock_policy)2>::
    _M_enable_shared_from_this_with<kratos::VarExtend,kratos::VarExtend>
              ((__shared_ptr<kratos::VarExtend,(__gnu_cxx::_Lock_policy)2> *)&local_30,local_30);
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    std::
    _Hashtable<unsigned_int,std::pair<unsigned_int_const,std::shared_ptr<kratos::VarExtend>>,std::allocator<std::pair<unsigned_int_const,std::shared_ptr<kratos::VarExtend>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<unsigned_int&,std::shared_ptr<kratos::VarExtend>&>
              ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,std::shared_ptr<kratos::VarExtend>>,std::allocator<std::pair<unsigned_int_const,std::shared_ptr<kratos::VarExtend>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->extended_,
               (undefined1 *)
               ((long)&p.super___shared_ptr<kratos::VarExtend,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 4),&local_30);
    peVar5 = local_30;
    if (p.super___shared_ptr<kratos::VarExtend,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 p.super___shared_ptr<kratos::VarExtend,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    }
  }
  else {
    pmVar3 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<kratos::VarExtend>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<kratos::VarExtend>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<kratos::VarExtend>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<kratos::VarExtend>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)&this->extended_,
                  (key_type *)
                  ((long)&p.super___shared_ptr<kratos::VarExtend,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi + 4));
    peVar5 = (pmVar3->super___shared_ptr<kratos::VarExtend,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  }
  return peVar5;
}

Assistant:

VarExtend &Var::extend(uint32_t width) {
    if (extended_.find(width) != extended_.end()) {
        return *extended_.at(width);
    } else {
        auto p = std::make_shared<VarExtend>(shared_from_this(), width);
        extended_.emplace(width, p);
        return *p;
    }
}